

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CursorImpl.cpp
# Opt level: O0

bool __thiscall
sf::priv::CursorImpl::loadFromPixelsMonochrome
          (CursorImpl *this,Uint8 *pixels,Vector2u size,Vector2u hotspot)

{
  byte bVar1;
  byte *pbVar2;
  undefined8 uVar3;
  reference pvVar4;
  undefined8 uVar5;
  ulong in_RCX;
  ulong in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  XColor bg;
  XColor fg;
  Pixmap dataPixmap;
  Pixmap maskPixmap;
  Uint8 bit;
  int intensity;
  Uint8 opacity;
  size_t bitIndex;
  size_t byteIndex;
  size_t pixelIndex;
  size_t i;
  size_t j;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> mask;
  size_t bytes;
  size_t packedWidth;
  allocator_type *in_stack_fffffffffffffeb8;
  value_type_conflict3 *in_stack_fffffffffffffec0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  size_type in_stack_fffffffffffffec8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffed0;
  undefined1 local_e8 [8];
  undefined2 local_e0;
  undefined2 local_de;
  undefined2 local_dc;
  undefined1 local_d8 [8];
  undefined2 local_d0;
  undefined2 local_ce;
  undefined2 local_cc;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined1 local_b1;
  uint local_b0;
  undefined1 local_a9;
  ulong local_a8;
  size_type local_a0;
  long local_98;
  ulong local_90;
  ulong local_88;
  undefined1 local_79;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  undefined1 local_49;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  long local_30;
  ulong local_28;
  long local_20;
  undefined8 local_10;
  undefined8 local_8;
  
  local_8._0_4_ = (int)in_RDX;
  local_28 = (ulong)((int)local_8 + 7U >> 3);
  local_30 = local_28 * (in_RDX >> 0x20);
  local_49 = 0;
  local_20 = in_RSI;
  local_10 = in_RCX;
  local_8 = in_RDX;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x3254db);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
             in_stack_fffffffffffffeb8);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x325509);
  local_79 = 0;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x325530);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
             in_stack_fffffffffffffeb8);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x32555e);
  for (local_88 = 0; local_88 < local_8 >> 0x20; local_88 = local_88 + 1) {
    for (local_90 = 0; local_90 < (local_8 & 0xffffffff); local_90 = local_90 + 1) {
      local_98 = local_90 + local_88 * (local_8 & 0xffffffff);
      local_a0 = (local_90 >> 3) + local_88 * local_28;
      local_a8 = local_90 & 7;
      local_a9 = *(char *)(local_20 + 3 + local_98 * 4) != '\0';
      bVar1 = local_a9 << (sbyte)local_a8;
      pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&local_48,local_a0);
      *pbVar2 = *pbVar2 | bVar1;
      local_b0 = ((uint)*(byte *)(local_20 + local_98 * 4) +
                  (uint)*(byte *)(local_20 + 1 + local_98 * 4) +
                 (uint)*(byte *)(local_20 + 2 + local_98 * 4)) / 3;
      local_b1 = 0x80 < local_b0;
      bVar1 = local_b1 << ((byte)local_a8 & 0x1f);
      pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&local_78,local_a0);
      *pbVar2 = *pbVar2 | bVar1;
    }
  }
  uVar5 = *in_RDI;
  uVar3 = XDefaultRootWindow();
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_48,0);
  local_c0 = XCreateBitmapFromData(uVar5,uVar3,pvVar4,local_8 & 0xffffffff,local_8._4_4_);
  this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)*in_RDI;
  uVar5 = XDefaultRootWindow();
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_78,0);
  local_c8 = XCreateBitmapFromData(this_00,uVar5,pvVar4,local_8 & 0xffffffff,local_8._4_4_);
  local_d0 = 0xffff;
  local_cc = 0xffff;
  local_ce = 0xffff;
  local_e0 = 0;
  local_dc = 0;
  local_de = 0;
  uVar5 = XCreatePixmapCursor(*in_RDI,local_c8,local_c0,local_d8,local_e8,local_10 & 0xffffffff,
                              local_10._4_4_);
  in_RDI[1] = uVar5;
  XFreePixmap(*in_RDI,local_c8);
  XFreePixmap(*in_RDI,local_c0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(this_00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(this_00);
  return true;
}

Assistant:

bool CursorImpl::loadFromPixelsMonochrome(const Uint8* pixels, Vector2u size, Vector2u hotspot)
{
    // Convert the image into a bitmap (monochrome!).
    // The bit data is stored packed into bytes. If the number of pixels on each row of the image
    // does not fit exactly into (width/8) bytes, one extra byte is allocated at the end of each
    // row to store the extra pixels.
    std::size_t packedWidth = (size.x + 7) / 8;
    std::size_t bytes = packedWidth * size.y;
    std::vector<Uint8> mask(bytes, 0); // Defines which pixel is opaque (1) or transparent (0).
    std::vector<Uint8> data(bytes, 0); // Defines which pixel is white (1) or black (0).

    for (std::size_t j = 0; j < size.y; ++j)
    {
        for (std::size_t i = 0; i < size.x; ++i)
        {
            std::size_t pixelIndex = i + j * size.x;
            std::size_t byteIndex  = i / 8 + j * packedWidth;
            std::size_t bitIndex   = i % 8;

            // Turn on pixel that are not transparent
            Uint8 opacity = pixels[pixelIndex * 4 + 3] > 0 ? 1 : 0;
            mask[byteIndex] |= static_cast<Uint8>(opacity << bitIndex);

            // Choose between black/background & white/foreground color for each pixel,
            // based on the pixel color intensity: on average, if a channel is "active"
            // at 50%, the bit is white.
            int intensity = (pixels[pixelIndex * 4 + 0] + pixels[pixelIndex * 4 + 1] + pixels[pixelIndex * 4 + 2]) / 3;
            Uint8 bit = intensity > 128 ? 1 : 0;
            data[byteIndex] |= static_cast<Uint8>(bit << bitIndex);
        }
    }

    Pixmap maskPixmap = XCreateBitmapFromData(m_display, XDefaultRootWindow(m_display),
                                              reinterpret_cast<char*>(&mask[0]), size.x, size.y);
    Pixmap dataPixmap = XCreateBitmapFromData(m_display, XDefaultRootWindow(m_display),
                                              reinterpret_cast<char*>(&data[0]), size.x, size.y);

    // Define the foreground color as white and the background as black.
    XColor fg, bg;
    fg.red   = 0xFFFF;
    fg.blue  = 0xFFFF;
    fg.green = 0xFFFF;
    bg.red   = 0x0000;
    bg.blue  = 0x0000;
    bg.green = 0x0000;

    // Create the monochrome cursor.
    m_cursor = XCreatePixmapCursor(m_display,
                                   dataPixmap, maskPixmap,
                                   &fg, &bg,
                                   hotspot.x, hotspot.y);

    // Free the resources
    XFreePixmap(m_display, dataPixmap);
    XFreePixmap(m_display, maskPixmap);

    // We assume everything went fine...
    return true;
}